

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall FlowGraph::FindLoops(FlowGraph *this)

{
  code *pcVar1;
  FlowEdge **this_00;
  bool bVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppFVar4;
  BasicBlock *headBlock;
  Instr *this_02;
  LabelInstr *pLVar5;
  BasicBlock *succ;
  FlowEdge **__edge;
  Iterator __iter;
  BasicBlock *block;
  BasicBlock *blockStop;
  Func *func;
  FlowGraph *this_local;
  
  if ((this->hasLoop & 1U) != 0) {
    for (__iter.current = (NodeBase *)this->func->m_fg->tailBlock; __iter.current != (NodeBase *)0x0
        ; __iter.current = __iter.current[1].next) {
      if ((((ulong)__iter.current[3].next & 1) == 0) && (__iter.current[2].next == (Type)0x0)) {
        this_01 = &BasicBlock::GetSuccList((BasicBlock *)__iter.current)->
                   super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>;
        ___edge = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::GetIterator(this_01);
        while( true ) {
          if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          this_00 = __edge;
          node = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          bVar2 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                            ((SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)this_00,
                             node);
          if (bVar2) break;
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          ppFVar4 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                              ((Iterator *)&__edge);
          headBlock = FlowEdge::GetSucc(*ppFVar4);
          if (headBlock == (BasicBlock *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                               ,0x4dd,"(succ)","succ");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          if (((*(ushort *)&headBlock->field_0x18 >> 2 & 1) != 0) &&
             (headBlock->loop == (Loop *)0x0)) {
            BuildLoop(this,headBlock,(BasicBlock *)__iter.current,(Loop *)0x0);
          }
        }
        if (((*(ushort *)&__iter.current[3].next >> 2 & 1) != 0) &&
           (__iter.current[2].next == (Type)0x0)) {
          *(ushort *)&__iter.current[3].next = *(ushort *)&__iter.current[3].next & 0xfffb;
          this_02 = BasicBlock::GetFirstInstr((BasicBlock *)__iter.current);
          pLVar5 = IR::Instr::AsLabelInstr(this_02);
          pLVar5->field_0x78 = pLVar5->field_0x78 & 0xfe;
        }
      }
    }
  }
  return;
}

Assistant:

void
FlowGraph::FindLoops()
{
    if (!this->hasLoop)
    {
        return;
    }

    Func * func = this->func;

    FOREACH_BLOCK_BACKWARD_IN_FUNC(block, func)
    {
        if (block->loop != nullptr)
        {
            // Block already visited
            continue;
        }
        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader && succ->loop == nullptr)
            {
                // Found a loop back-edge
                BuildLoop(succ, block);
            }
        } NEXT_SUCCESSOR_BLOCK;
        if (block->isLoopHeader && block->loop == nullptr)
        {
            // We would have built a loop for it if it was a loop...
            block->isLoopHeader = false;
            block->GetFirstInstr()->AsLabelInstr()->m_isLoopTop = false;
        }
    } NEXT_BLOCK_BACKWARD_IN_FUNC;
}